

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseUnaryExpression(Parser *this)

{
  TokenType TVar1;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  size_type sVar2;
  CalculationEngine *this_01;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  Parser *this_02;
  OperatorChar op;
  _Head_base<0UL,_Expression_*,_false> local_88;
  CalculationEngine *local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == OPERATOR) {
    op = anon_unknown.dwarf_76052::tokenAsOperator(&in_RSI->mCurrentToken);
    nextToken(in_RSI);
    parseUnaryExpression((Parser *)&local_80);
    if (local_80 == (CalculationEngine *)0x0) {
      this->mCalcEngine = (CalculationEngine *)0x0;
    }
    else {
      this_00 = &CalculationEngine::unaryOperators(in_RSI->mCalcEngine)->_M_h;
      sVar2 = std::
              _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count(this_00,&op);
      if (sVar2 == 0) {
        OperatorChar::toString_abi_cxx11_(&local_78,&op);
        std::operator+(&local_58,"\'",&local_78);
        this_02 = (Parser *)&stack0xffffffffffffffc8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                       &local_58,"\' is not a defined unary operator.");
        parseError(this_02,(string *)&stack0xffffffffffffffc8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        if (local_80 != (CalculationEngine *)0x0) {
          (**(code **)(*(long *)local_80 + 8))();
        }
        _Unwind_Resume(extraout_RAX);
      }
      this_01 = (CalculationEngine *)operator_new(0x18);
      local_88._M_head_impl = (Expression *)local_80;
      local_80 = (CalculationEngine *)0x0;
      UnaryOperatorExpression::UnaryOperatorExpression
                ((UnaryOperatorExpression *)this_01,op,
                 (unique_ptr<Expression,_std::default_delete<Expression>_> *)&local_88);
      this->mCalcEngine = this_01;
      if ((CalculationEngine *)local_88._M_head_impl != (CalculationEngine *)0x0) {
        (*(local_88._M_head_impl)->_vptr_Expression[1])();
      }
      local_88._M_head_impl = (Expression *)0x0;
      if (local_80 != (CalculationEngine *)0x0) {
        (**(code **)(*(long *)local_80 + 8))();
      }
    }
  }
  else {
    parsePrimaryExpression(this);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseUnaryExpression() {
	//If the current token isn't an operator, is must be a primary expression
	if (mCurrentToken.type() != TokenType::OPERATOR) {
		return parsePrimaryExpression();
	}

	//If this is a unary operator, read it.
	auto op = tokenAsOperator(mCurrentToken);
	nextToken(); //Eat the operator

	auto operand = parseUnaryExpression();

	if (operand != nullptr) {
		if (mCalcEngine.unaryOperators().count(op) == 0) {
			parseError("'" + op.toString() + "' is not a defined unary operator.");
		}

		return std::unique_ptr<UnaryOperatorExpression>(
			new UnaryOperatorExpression(op, std::move(operand)));
	}

	return operand;
}